

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

int ptrstr(void)

{
  ostream *poVar1;
  void *pvVar2;
  size_t sVar3;
  char *__dest;
  char *local_38;
  char *ps;
  char *bird;
  char animal [20];
  
  bird = (char *)0x72616562;
  animal[0] = '\0';
  animal[1] = '\0';
  animal[2] = '\0';
  animal[3] = '\0';
  animal[4] = '\0';
  animal[5] = '\0';
  animal[6] = '\0';
  animal[7] = '\0';
  animal[8] = '\0';
  animal[9] = '\0';
  animal[10] = '\0';
  animal[0xb] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)&bird);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = std::operator<<(poVar1,"wren");
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,*local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"input a kind of animal:");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,(char *)&bird);
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)&bird);
  std::operator<<(poVar1,"!\n");
  std::operator<<((ostream *)&std::cout,"before using strcpy(): \n");
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)&bird);
  poVar1 = std::operator<<(poVar1," at ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,&bird);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)&bird);
  poVar1 = std::operator<<(poVar1," at ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,&bird);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = strlen((char *)&bird);
  __dest = (char *)operator_new__(sVar3 + 1);
  strcpy(__dest,(char *)&bird);
  std::operator<<((ostream *)&std::cout,"after using strcpy(): \n");
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)&bird);
  poVar1 = std::operator<<(poVar1," at ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,&bird);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,__dest);
  poVar1 = std::operator<<(poVar1," at ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,__dest);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  if (__dest != (char *)0x0) {
    operator_delete__(__dest);
  }
  return 0;
}

Assistant:

int ptrstr () {
    using namespace std;
    char animal[20] = "bear";
    const char * bird = "wren";
    char * ps;

    cout << animal << " and " << bird << "\n";
    cout << *ps << endl; // uninitialized values
    cout << "input a kind of animal:";
    cin >> animal;
    ps = animal;
    cout << ps << "!\n";

    cout << "before using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;

    //  new address
    ps = new char[strlen(animal) + 1];
    //  copy value to the newly created address
    strcpy(ps, animal);
    cout << "after using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;
    delete [] ps;

    return 0;
}